

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall gl3cts::TransformFeedback::QueryGeometrySeparate::clean(QueryGeometrySeparate *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  QueryGeometrySeparate *this_local;
  
  pRVar2 = deqp::Context::getRenderContext
                     (*(Context **)
                       (&(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                         field_0x78 +
                       (long)(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                             _vptr_CaptureGeometryInterleaved[-3]));
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x458))
            (1,&(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.field_0x14);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glDeleteQueries call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1020);
  CaptureVertexInterleaved::clean
            ((CaptureVertexInterleaved *)
             ((long)&(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                     _vptr_CaptureGeometryInterleaved +
             (long)(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                   _vptr_CaptureGeometryInterleaved[-3]));
  return;
}

Assistant:

void gl3cts::TransformFeedback::QueryGeometrySeparate::clean(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Delete query object. */
	gl.deleteQueries(1, &m_query_object);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteQueries call failed.");

	/* Other */
	gl3cts::TransformFeedback::CaptureGeometrySeparate::clean();
}